

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_harbor.c
# Opt level: O3

void harbor_command(harbor *h,char *msg,size_t sz,int session,uint32_t source)

{
  char *__src;
  uint32_t *puVar1;
  byte bVar2;
  char cVar3;
  hashmap *hash;
  harbor_msg_queue *phVar4;
  harbor_msg *phVar5;
  long lVar6;
  long lVar7;
  undefined1 *buffer;
  keyvalue *pkVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  char *msg_00;
  skynet_context *psVar13;
  undefined4 in_register_00000084;
  ulong __n;
  uint uVar14;
  void *__dest;
  undefined8 uStack_80;
  uint uStack_78;
  undefined4 uStack_74;
  int id;
  undefined4 uStack_6c;
  undefined1 local_68;
  undefined8 uStack_58;
  int fd;
  uint uStack_4c;
  int local_48;
  skynet_context *local_40;
  keyvalue *local_38;
  
  local_40 = (skynet_context *)&uStack_78;
  __src = msg + 2;
  iVar12 = (int)sz;
  __n = (long)iVar12 - 2;
  bVar2 = *msg;
  uVar11 = (ulong)bVar2;
  if ((bVar2 == 0x41) || (bVar2 == 0x53)) {
    lVar6 = -((ulong)(iVar12 - 1) + 0xf & 0xfffffffffffffff0);
    __dest = (void *)((long)&uStack_78 + lVar6);
    *(undefined8 *)((long)&uStack_80 + lVar6) = 0x10dd9e;
    memcpy(__dest,__src,__n);
    *(undefined1 *)(__n + (long)__dest) = 0;
    uStack_58 = (ulong)uStack_58._4_4_ << 0x20;
    uStack_78 = 0;
    *(undefined8 *)((long)&uStack_80 + lVar6) = 0x10ddcc;
    __isoc99_sscanf(__dest,"%d %d",&uStack_58,&uStack_78);
    iVar12 = (uint)uStack_58;
    if (uStack_78 - 0x100 < 0xffffff01 || (uint)uStack_58 == 0) {
      psVar13 = h->ctx;
      cVar3 = *msg;
      *(undefined8 *)((long)&uStack_80 + lVar6) = 0x10de07;
      skynet_error(psVar13,"Invalid command %c %s",(ulong)(uint)(int)cVar3,__dest);
    }
    else {
      uVar11 = (ulong)uStack_78;
      if (h->s[uVar11].fd == 0) {
        local_38 = (keyvalue *)h->s;
        h->s[uVar11].fd = (uint)uStack_58;
        psVar13 = h->ctx;
        *(undefined8 *)((long)&uStack_80 + lVar6) = 0x10df5c;
        skynet_socket_start(psVar13,iVar12);
        lVar7 = (long)(int)uStack_78;
        *(undefined8 *)((long)&uStack_80 + lVar6) = 0x10df6e;
        buffer = (undefined1 *)malloc(1);
        *buffer = (char)h->id;
        psVar13 = h->ctx;
        iVar12 = ((slave *)(local_38 + lVar7))->fd;
        *(undefined8 *)((long)&uStack_80 + lVar6) = 0x10df8b;
        skynet_socket_send(psVar13,iVar12,buffer,1);
        uVar9 = uStack_78;
        if (*msg == 'S') {
          h->s[uVar11].status = 1;
        }
        else {
          h->s[uVar11].status = 2;
          *(undefined8 *)((long)&uStack_80 + lVar6) = 0x10dfae;
          dispatch_queue(h,uVar9);
        }
      }
      else {
        psVar13 = h->ctx;
        *(undefined8 *)((long)&uStack_80 + lVar6) = 0x10de36;
        skynet_error(psVar13,"Harbor %d alreay exist");
      }
    }
    return;
  }
  if (bVar2 == 0x4e) {
    uVar11 = (ulong)(iVar12 - 0x12U);
    if (0xfffffff0 < iVar12 - 0x12U) {
      uStack_58 = 0;
      _fd = 0;
      uStack_80 = (code *)0x10de76;
      memcpy(&uStack_58,__src,__n & 0xffffffff);
      hash = h->map;
      uStack_80 = (code *)0x10de89;
      local_48 = session;
      local_38 = hash_search(hash,(char *)&uStack_58);
      if (local_38 == (keyvalue *)0x0) {
        uVar9 = uStack_58._4_4_ ^ (uint)uStack_58 ^ fd ^ uStack_4c;
        uVar14 = uVar9 & 0xfff;
        uStack_80 = (code *)0x10dfe0;
        pkVar8 = (keyvalue *)malloc(0x28);
        *(long *)pkVar8->key = uStack_58;
        *(undefined8 *)(pkVar8->key + 8) = _fd;
        pkVar8->next = hash->node[uVar14];
        pkVar8->queue = (harbor_msg_queue *)0x0;
        pkVar8->hash = uVar9;
        hash->node[uVar14] = pkVar8;
        pkVar8->value = session;
        return;
      }
      phVar4 = local_38->queue;
      local_38->value = session;
      if (phVar4 == (harbor_msg_queue *)0x0) {
        return;
      }
      if ((uint)session < 0x1000000) {
        uStack_80 = remote_send_handle;
        __assert_fail("harbor_id != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/service-src/service_harbor.c"
                      ,0x15d,"void dispatch_name_queue(struct harbor *, struct keyvalue *)");
      }
      uVar9 = (uint)session >> 0x18;
      local_40 = h->ctx;
      iVar12 = h->s[uVar9].fd;
      if (iVar12 == 0) {
        if (h->s[uVar9].status == 4) {
          uStack_78 = *(uint *)local_38->key;
          uStack_74 = *(undefined4 *)(local_38->key + 4);
          id = *(int *)(local_38->key + 8);
          uStack_6c = *(undefined4 *)(local_38->key + 0xc);
          local_68 = 0;
          uStack_80 = (code *)0x10e037;
          skynet_error(local_40,"Drop message to %s (in harbor %d)");
        }
        else if (h->s[uVar9].queue == (harbor_msg_queue *)0x0) {
          h->s[uVar9].queue = phVar4;
          local_38->queue = (harbor_msg_queue *)0x0;
        }
        else {
          while (iVar12 = phVar4->head, iVar12 != phVar4->tail) {
            phVar4->head = (iVar12 + 1) % phVar4->size;
            if (phVar4->data == (harbor_msg *)0x0) break;
            uStack_80 = (code *)0x10e071;
            push_queue_msg(h->s[uVar9].queue,phVar4->data + iVar12);
          }
        }
      }
      else {
        iVar10 = phVar4->head;
        if (iVar10 != phVar4->tail) {
          do {
            phVar5 = phVar4->data;
            phVar4->head = (iVar10 + 1) % phVar4->size;
            if (phVar5 == (harbor_msg *)0x0) break;
            puVar1 = &phVar5[iVar10].header.destination;
            *puVar1 = *puVar1 | session & 0xffffffU;
            uStack_80 = (code *)0x10df28;
            send_remote(local_40,iVar12,(char *)phVar5[iVar10].buffer,phVar5[iVar10].size,
                        &phVar5[iVar10].header);
            uStack_80 = (code *)0x10df32;
            free(phVar5[iVar10].buffer);
            iVar10 = phVar4->head;
          } while (iVar10 != phVar4->tail);
        }
      }
      pkVar8 = local_38;
      uStack_80 = (code *)0x10e090;
      release_queue(local_38->queue);
      pkVar8->queue = (harbor_msg_queue *)0x0;
      return;
    }
    psVar13 = h->ctx;
    msg_00 = "Invalid global name %s";
    msg = __src;
  }
  else {
    psVar13 = h->ctx;
    msg_00 = "Unknown command %s";
  }
  skynet_error(psVar13,msg_00,msg,uVar11,CONCAT44(in_register_00000084,source));
  return;
}

Assistant:

static void
harbor_command(struct harbor * h, const char * msg, size_t sz, int session, uint32_t source) {
	const char * name = msg + 2;
	int s = (int)sz;
	s -= 2;
	switch(msg[0]) {
	case 'N' : {
		if (s <=0 || s>= GLOBALNAME_LENGTH) {
			skynet_error(h->ctx, "Invalid global name %s", name);
			return;
		}
		struct remote_name rn;
		memset(&rn, 0, sizeof(rn));
		memcpy(rn.name, name, s);
		rn.handle = source;
		update_name(h, rn.name, rn.handle);
		break;
	}
	case 'S' :
	case 'A' : {
		char buffer[s+1];
		memcpy(buffer, name, s);
		buffer[s] = 0;
		int fd=0, id=0;
		sscanf(buffer, "%d %d",&fd,&id);
		if (fd == 0 || id <= 0 || id>=REMOTE_MAX) {
			skynet_error(h->ctx, "Invalid command %c %s", msg[0], buffer);
			return;
		}
		struct slave * slave = &h->s[id];
		if (slave->fd != 0) {
			skynet_error(h->ctx, "Harbor %d alreay exist", id);
			return;
		}
		slave->fd = fd;

		skynet_socket_start(h->ctx, fd);
		handshake(h, id);
		if (msg[0] == 'S') {
			slave->status = STATUS_HANDSHAKE;
		} else {
			slave->status = STATUS_HEADER;
			dispatch_queue(h,id);
		}
		break;
	}
	default:
		skynet_error(h->ctx, "Unknown command %s", msg);
		return;
	}
}